

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<4,_1,_true,_embree::avx::SubdivPatch1Intersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  ulong uVar4;
  RTCRayQueryContext *pRVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  undefined1 auVar59 [32];
  int iVar60;
  uint uVar61;
  long lVar62;
  Geometry *pGVar63;
  uint uVar64;
  ulong uVar65;
  undefined1 (*pauVar66) [16];
  long lVar67;
  undefined1 (*pauVar68) [16];
  ulong uVar69;
  ulong uVar70;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  undefined4 uVar74;
  ulong unaff_R12;
  ulong uVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar81 [32];
  float fVar85;
  float fVar89;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar90;
  float fVar97;
  float fVar98;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar95 [32];
  float fVar99;
  undefined1 auVar96 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  float fVar121;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  float fVar129;
  undefined1 auVar130 [16];
  float fVar136;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar133 [64];
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar156;
  float fVar158;
  undefined1 auVar145 [32];
  float fVar147;
  float fVar149;
  float fVar151;
  float fVar153;
  float fVar155;
  float fVar157;
  undefined1 auVar146 [64];
  float fVar159;
  float fVar168;
  undefined1 auVar160 [24];
  undefined1 auVar162 [32];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar169;
  undefined1 auVar163 [64];
  float fVar170;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar173 [64];
  float fVar180;
  float fVar185;
  undefined1 auVar181 [16];
  float fVar183;
  float fVar184;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [64];
  float fVar189;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar192 [64];
  float fVar199;
  float fVar200;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar201 [64];
  float fVar215;
  float fVar216;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar217 [64];
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar227 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MapUV<embree::avx::GridSOA::Gather3x3> mapUV;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_1458;
  int local_144c;
  RayQueryContext *local_1448;
  undefined8 local_1440;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  ulong local_1408;
  RTCFilterFunctionNArguments local_1400;
  float local_13d0;
  undefined4 local_13cc;
  undefined4 local_13c8;
  float local_13c4;
  float local_13c0;
  uint local_13bc;
  undefined4 local_13b8;
  uint local_13b4;
  uint local_13b0;
  undefined1 (*local_1398) [16];
  ulong local_1390;
  ulong local_1388;
  undefined1 local_1380 [32];
  undefined1 local_1350 [16];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 (**local_1160) [16];
  undefined1 local_1140 [32];
  float local_1120 [4];
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  float local_1100 [4];
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [2] [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar161 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f98 = 0;
    if (local_fa0 != 8) {
      pauVar66 = (undefined1 (*) [16])local_f90;
      auVar130 = vmaxss_avx(ZEXT816(0) << 0x40,
                            ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar91 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar116._8_4_ = 0x7fffffff;
      auVar116._0_8_ = 0x7fffffff7fffffff;
      auVar116._12_4_ = 0x7fffffff;
      auVar116 = vandps_avx((undefined1  [16])aVar2,auVar116);
      auVar117._8_4_ = 0x219392ef;
      auVar117._0_8_ = 0x219392ef219392ef;
      auVar117._12_4_ = 0x219392ef;
      auVar116 = vcmpps_avx(auVar116,auVar117,1);
      auVar113._8_4_ = 0x3f800000;
      auVar113._0_8_ = &DAT_3f8000003f800000;
      auVar113._12_4_ = 0x3f800000;
      auVar117 = vdivps_avx(auVar113,(undefined1  [16])aVar2);
      auVar114._8_4_ = 0x5d5e0b6b;
      auVar114._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar114._12_4_ = 0x5d5e0b6b;
      auVar116 = vblendvps_avx(auVar117,auVar114,auVar116);
      auVar111._0_4_ = auVar116._0_4_ * 0.99999964;
      auVar111._4_4_ = auVar116._4_4_ * 0.99999964;
      auVar111._8_4_ = auVar116._8_4_ * 0.99999964;
      auVar111._12_4_ = auVar116._12_4_ * 0.99999964;
      auVar181._0_4_ = auVar116._0_4_ * 1.0000004;
      auVar181._4_4_ = auVar116._4_4_ * 1.0000004;
      auVar181._8_4_ = auVar116._8_4_ * 1.0000004;
      auVar181._12_4_ = auVar116._12_4_ * 1.0000004;
      uVar74 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_11d0._4_4_ = uVar74;
      local_11d0._0_4_ = uVar74;
      local_11d0._8_4_ = uVar74;
      local_11d0._12_4_ = uVar74;
      auVar133 = ZEXT1664(local_11d0);
      uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_11e0._4_4_ = uVar74;
      local_11e0._0_4_ = uVar74;
      local_11e0._8_4_ = uVar74;
      local_11e0._12_4_ = uVar74;
      auVar146 = ZEXT1664(local_11e0);
      uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_11f0._4_4_ = uVar74;
      local_11f0._0_4_ = uVar74;
      local_11f0._8_4_ = uVar74;
      local_11f0._12_4_ = uVar74;
      auVar163 = ZEXT1664(local_11f0);
      local_1200 = vshufps_avx(auVar111,auVar111,0);
      auVar173 = ZEXT1664(local_1200);
      auVar116 = vmovshdup_avx(auVar111);
      local_1210 = vshufps_avx(auVar111,auVar111,0x55);
      auVar182 = ZEXT1664(local_1210);
      auVar117 = vshufpd_avx(auVar111,auVar111,1);
      local_1220 = vshufps_avx(auVar111,auVar111,0xaa);
      auVar192 = ZEXT1664(local_1220);
      local_1230 = vshufps_avx(auVar181,auVar181,0);
      auVar201 = ZEXT1664(local_1230);
      local_1240 = vshufps_avx(auVar181,auVar181,0x55);
      auVar217 = ZEXT1664(local_1240);
      uVar69 = (ulong)(auVar111._0_4_ < 0.0) * 0x10;
      local_1250 = vshufps_avx(auVar181,auVar181,0xaa);
      auVar227 = ZEXT1664(local_1250);
      uVar75 = (ulong)(auVar116._0_4_ < 0.0) << 4 | 0x20;
      uVar65 = (ulong)(auVar117._0_4_ < 0.0) << 4 | 0x40;
      local_1408 = uVar69 ^ 0x10;
      local_1350 = vshufps_avx(auVar130,auVar130,0);
      auVar128 = ZEXT1664(local_1350);
      local_1080[1]._0_8_ = mm_lookupmask_pd._0_8_;
      local_1080[1]._8_8_ = mm_lookupmask_pd._8_8_;
      local_1080[1]._16_8_ = mm_lookupmask_pd._0_8_;
      local_1080[1]._24_8_ = mm_lookupmask_pd._8_8_;
      auVar116 = vshufps_avx(auVar91,auVar91,0);
      auVar79 = ZEXT1664(auVar116);
      local_1458 = 0;
      local_1448 = context;
      do {
        do {
          do {
            if (pauVar66 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            pauVar68 = pauVar66 + -1;
            pauVar66 = pauVar66 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar68 + 8));
          uVar73 = *(ulong *)*pauVar66;
          do {
            if ((uVar73 & 8) == 0) {
              auVar116 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + uVar69),auVar133._0_16_);
              auVar130._0_4_ = auVar173._0_4_ * auVar116._0_4_;
              auVar130._4_4_ = auVar173._4_4_ * auVar116._4_4_;
              auVar130._8_4_ = auVar173._8_4_ * auVar116._8_4_;
              auVar130._12_4_ = auVar173._12_4_ * auVar116._12_4_;
              auVar116 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + uVar75),auVar146._0_16_);
              auVar91._0_4_ = auVar182._0_4_ * auVar116._0_4_;
              auVar91._4_4_ = auVar182._4_4_ * auVar116._4_4_;
              auVar91._8_4_ = auVar182._8_4_ * auVar116._8_4_;
              auVar91._12_4_ = auVar182._12_4_ * auVar116._12_4_;
              auVar116 = vmaxps_avx(auVar130,auVar91);
              auVar117 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + uVar65),auVar163._0_16_);
              auVar92._0_4_ = auVar192._0_4_ * auVar117._0_4_;
              auVar92._4_4_ = auVar192._4_4_ * auVar117._4_4_;
              auVar92._8_4_ = auVar192._8_4_ * auVar117._8_4_;
              auVar92._12_4_ = auVar192._12_4_ * auVar117._12_4_;
              auVar117 = vmaxps_avx(auVar92,auVar128._0_16_);
              local_11c0 = vmaxps_avx(auVar116,auVar117);
              auVar116 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + local_1408),
                                    auVar133._0_16_);
              auVar93._0_4_ = auVar201._0_4_ * auVar116._0_4_;
              auVar93._4_4_ = auVar201._4_4_ * auVar116._4_4_;
              auVar93._8_4_ = auVar201._8_4_ * auVar116._8_4_;
              auVar93._12_4_ = auVar201._12_4_ * auVar116._12_4_;
              auVar116 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + (uVar75 ^ 0x10)),
                                    auVar146._0_16_);
              auVar103._0_4_ = auVar217._0_4_ * auVar116._0_4_;
              auVar103._4_4_ = auVar217._4_4_ * auVar116._4_4_;
              auVar103._8_4_ = auVar217._8_4_ * auVar116._8_4_;
              auVar103._12_4_ = auVar217._12_4_ * auVar116._12_4_;
              auVar116 = vminps_avx(auVar93,auVar103);
              auVar117 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + (uVar65 ^ 0x10)),
                                    auVar163._0_16_);
              auVar104._0_4_ = auVar227._0_4_ * auVar117._0_4_;
              auVar104._4_4_ = auVar227._4_4_ * auVar117._4_4_;
              auVar104._8_4_ = auVar227._8_4_ * auVar117._8_4_;
              auVar104._12_4_ = auVar227._12_4_ * auVar117._12_4_;
              auVar117 = vminps_avx(auVar104,auVar79._0_16_);
              auVar116 = vminps_avx(auVar116,auVar117);
              auVar116 = vcmpps_avx(local_11c0,auVar116,2);
              uVar74 = vmovmskps_avx(auVar116);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar74);
            }
            if ((uVar73 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar60 = 4;
              }
              else {
                uVar72 = uVar73 & 0xfffffffffffffff0;
                lVar62 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                  }
                }
                iVar60 = 0;
                uVar73 = *(ulong *)(uVar72 + lVar62 * 8);
                uVar70 = unaff_R12 - 1 & unaff_R12;
                if (uVar70 != 0) {
                  uVar3 = *(uint *)(local_11c0 + lVar62 * 4);
                  lVar62 = 0;
                  if (uVar70 != 0) {
                    for (; (uVar70 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                    }
                  }
                  uVar4 = *(ulong *)(uVar72 + lVar62 * 8);
                  uVar71 = *(uint *)(local_11c0 + lVar62 * 4);
                  uVar70 = uVar70 - 1 & uVar70;
                  if (uVar70 == 0) {
                    if (uVar3 < uVar71) {
                      *(ulong *)*pauVar66 = uVar4;
                      *(uint *)(*pauVar66 + 8) = uVar71;
                      pauVar66 = pauVar66 + 1;
                    }
                    else {
                      *(ulong *)*pauVar66 = uVar73;
                      *(uint *)(*pauVar66 + 8) = uVar3;
                      pauVar66 = pauVar66 + 1;
                      uVar73 = uVar4;
                    }
                  }
                  else {
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = uVar73;
                    auVar116 = vpunpcklqdq_avx(auVar80,ZEXT416(uVar3));
                    auVar94._8_8_ = 0;
                    auVar94._0_8_ = uVar4;
                    auVar117 = vpunpcklqdq_avx(auVar94,ZEXT416(uVar71));
                    lVar62 = 0;
                    if (uVar70 != 0) {
                      for (; (uVar70 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                      }
                    }
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ = *(ulong *)(uVar72 + lVar62 * 8);
                    auVar91 = vpunpcklqdq_avx(auVar105,ZEXT416(*(uint *)(local_11c0 + lVar62 * 4)));
                    auVar130 = vpcmpgtd_avx(auVar117,auVar116);
                    uVar70 = uVar70 - 1 & uVar70;
                    if (uVar70 == 0) {
                      auVar181 = vpshufd_avx(auVar130,0xaa);
                      auVar130 = vblendvps_avx(auVar117,auVar116,auVar181);
                      auVar116 = vblendvps_avx(auVar116,auVar117,auVar181);
                      auVar117 = vpcmpgtd_avx(auVar91,auVar130);
                      auVar181 = vpshufd_avx(auVar117,0xaa);
                      auVar117 = vblendvps_avx(auVar91,auVar130,auVar181);
                      auVar130 = vblendvps_avx(auVar130,auVar91,auVar181);
                      auVar91 = vpcmpgtd_avx(auVar130,auVar116);
                      auVar181 = vpshufd_avx(auVar91,0xaa);
                      auVar91 = vblendvps_avx(auVar130,auVar116,auVar181);
                      auVar116 = vblendvps_avx(auVar116,auVar130,auVar181);
                      *pauVar66 = auVar116;
                      pauVar66[1] = auVar91;
                      uVar73 = auVar117._0_8_;
                      pauVar66 = pauVar66 + 2;
                    }
                    else {
                      lVar62 = 0;
                      if (uVar70 != 0) {
                        for (; (uVar70 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                        }
                      }
                      auVar115._8_8_ = 0;
                      auVar115._0_8_ = *(ulong *)(uVar72 + lVar62 * 8);
                      auVar111 = vpunpcklqdq_avx(auVar115,ZEXT416(*(uint *)(local_11c0 + lVar62 * 4)
                                                                 ));
                      auVar181 = vpshufd_avx(auVar130,0xaa);
                      auVar130 = vblendvps_avx(auVar117,auVar116,auVar181);
                      auVar116 = vblendvps_avx(auVar116,auVar117,auVar181);
                      auVar117 = vpcmpgtd_avx(auVar111,auVar91);
                      auVar181 = vpshufd_avx(auVar117,0xaa);
                      auVar117 = vblendvps_avx(auVar111,auVar91,auVar181);
                      auVar91 = vblendvps_avx(auVar91,auVar111,auVar181);
                      auVar181 = vpcmpgtd_avx(auVar91,auVar116);
                      auVar111 = vpshufd_avx(auVar181,0xaa);
                      auVar181 = vblendvps_avx(auVar91,auVar116,auVar111);
                      auVar116 = vblendvps_avx(auVar116,auVar91,auVar111);
                      auVar91 = vpcmpgtd_avx(auVar117,auVar130);
                      auVar111 = vpshufd_avx(auVar91,0xaa);
                      auVar91 = vblendvps_avx(auVar117,auVar130,auVar111);
                      auVar117 = vblendvps_avx(auVar130,auVar117,auVar111);
                      auVar130 = vpcmpgtd_avx(auVar181,auVar117);
                      auVar111 = vpshufd_avx(auVar130,0xaa);
                      auVar130 = vblendvps_avx(auVar181,auVar117,auVar111);
                      auVar117 = vblendvps_avx(auVar117,auVar181,auVar111);
                      *pauVar66 = auVar116;
                      pauVar66[1] = auVar117;
                      pauVar66[2] = auVar130;
                      auVar128 = ZEXT1664(local_1350);
                      uVar73 = auVar91._0_8_;
                      pauVar66 = pauVar66 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar60 = 6;
            }
          } while (iVar60 == 0);
        } while (iVar60 != 6);
        if (((uint)uVar73 & 0xf) == 8) {
          uVar3 = *(uint *)(local_1458 + 0xc);
          local_1390 = (ulong)uVar3;
          uVar71 = *(uint *)(local_1458 + 0x10);
          local_1388 = (ulong)uVar71;
          lVar67 = *(uint *)(local_1458 + 0x24) + local_1458;
          uVar73 = uVar73 >> 4;
          lVar62 = lVar67 + uVar73 * 4;
          auVar116 = *(undefined1 (*) [16])(lVar62 + 0x2c + local_1390 * 4);
          auVar117 = auVar116;
          if (2 < local_1388) {
            auVar117 = *(undefined1 (*) [16])(lVar67 + uVar73 * 4 + 0x2c + local_1390 * 8);
          }
          auVar130 = *(undefined1 (*) [16])(lVar67 + 0x2c + uVar73 * 4);
          if (local_1390 == 2) {
            auVar130 = vshufps_avx(auVar130,auVar130,0x54);
            auVar116 = vshufps_avx(auVar116,auVar116,0x54);
            auVar117 = vshufps_avx(auVar117,auVar117,0x54);
          }
          uVar73 = (ulong)*(uint *)(local_1458 + 0x14);
          pauVar68 = (undefined1 (*) [16])(lVar62 + uVar73 * 4 + 0x2c);
          auVar91 = *(undefined1 (*) [16])(*pauVar68 + local_1390 * 4);
          auVar181 = auVar91;
          if (2 < uVar71) {
            auVar181 = *(undefined1 (*) [16])(*pauVar68 + local_1390 * 8);
          }
          auVar111 = *pauVar68;
          if (uVar3 == 2) {
            auVar111 = vshufps_avx(auVar111,auVar111,0x54);
            auVar91 = vshufps_avx(auVar91,auVar91,0x54);
            auVar181 = vshufps_avx(auVar181,auVar181,0x54);
          }
          pauVar68 = (undefined1 (*) [16])(lVar62 + uVar73 * 8 + 0x2c);
          auVar113 = *(undefined1 (*) [16])(*pauVar68 + local_1390 * 4);
          auVar114 = auVar113;
          if (2 < uVar71) {
            auVar114 = *(undefined1 (*) [16])(*pauVar68 + local_1390 * 8);
          }
          auVar95._16_16_ = auVar116;
          auVar95._0_16_ = auVar130;
          auVar76._16_16_ = auVar117;
          auVar76._0_16_ = auVar116;
          auVar19 = vunpcklps_avx(auVar95,auVar76);
          auVar95 = vshufps_avx(auVar95,auVar95,0xa5);
          auVar76 = vshufps_avx(auVar76,auVar76,0x94);
          auVar118._16_16_ = auVar91;
          auVar118._0_16_ = auVar111;
          auVar143._16_16_ = auVar181;
          auVar143._0_16_ = auVar91;
          auVar20 = vunpcklps_avx(auVar118,auVar143);
          auVar118 = vshufps_avx(auVar118,auVar118,0xa5);
          auVar143 = vshufps_avx(auVar143,auVar143,0x94);
          auVar116 = *pauVar68;
          if (uVar3 == 2) {
            auVar116 = vshufps_avx(auVar116,auVar116,0x54);
            auVar113 = vshufps_avx(auVar113,auVar113,0x54);
            auVar114 = vshufps_avx(auVar114,auVar114,0x54);
          }
          auVar144._16_16_ = auVar113;
          auVar144._0_16_ = auVar116;
          auVar122._16_16_ = auVar114;
          auVar122._0_16_ = auVar113;
          auVar21 = vunpcklps_avx(auVar144,auVar122);
          auVar16 = vshufps_avx(auVar144,auVar144,0xa5);
          auVar17 = vshufps_avx(auVar122,auVar122,0x94);
          uVar74 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar123._4_4_ = uVar74;
          auVar123._0_4_ = uVar74;
          auVar123._8_4_ = uVar74;
          auVar123._12_4_ = uVar74;
          auVar123._16_4_ = uVar74;
          auVar123._20_4_ = uVar74;
          auVar123._24_4_ = uVar74;
          auVar123._28_4_ = uVar74;
          uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar171._4_4_ = uVar74;
          auVar171._0_4_ = uVar74;
          auVar171._8_4_ = uVar74;
          auVar171._12_4_ = uVar74;
          auVar171._16_4_ = uVar74;
          auVar171._20_4_ = uVar74;
          auVar171._24_4_ = uVar74;
          auVar171._28_4_ = uVar74;
          uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar190._4_4_ = uVar1;
          auVar190._0_4_ = uVar1;
          auVar190._8_4_ = uVar1;
          auVar190._12_4_ = uVar1;
          auVar190._16_4_ = uVar1;
          auVar190._20_4_ = uVar1;
          auVar190._24_4_ = uVar1;
          auVar190._28_4_ = uVar1;
          local_12a0 = vsubps_avx(auVar19,auVar123);
          local_12e0 = vsubps_avx(auVar20,auVar171);
          local_12c0 = vsubps_avx(auVar21,auVar190);
          auVar95 = vsubps_avx(auVar95,auVar123);
          auVar118 = vsubps_avx(auVar118,auVar171);
          auVar19 = vsubps_avx(auVar16,auVar190);
          auVar76 = vsubps_avx(auVar76,auVar123);
          auVar143 = vsubps_avx(auVar143,auVar171);
          auVar20 = vsubps_avx(auVar17,auVar190);
          local_1300 = vsubps_avx(auVar76,local_12a0);
          local_1320 = vsubps_avx(auVar143,local_12e0);
          local_1340 = vsubps_avx(auVar20,local_12c0);
          fVar6 = local_12e0._0_4_;
          fVar129 = auVar143._0_4_ + fVar6;
          fVar8 = local_12e0._4_4_;
          fVar134 = auVar143._4_4_ + fVar8;
          fVar10 = local_12e0._8_4_;
          fVar135 = auVar143._8_4_ + fVar10;
          fVar85 = local_12e0._12_4_;
          fVar136 = auVar143._12_4_ + fVar85;
          fVar87 = local_12e0._16_4_;
          fVar137 = auVar143._16_4_ + fVar87;
          fVar89 = local_12e0._20_4_;
          fVar138 = auVar143._20_4_ + fVar89;
          fVar13 = local_12e0._24_4_;
          fVar139 = auVar143._24_4_ + fVar13;
          fVar7 = local_12c0._0_4_;
          fVar159 = auVar20._0_4_ + fVar7;
          fVar9 = local_12c0._4_4_;
          fVar164 = auVar20._4_4_ + fVar9;
          fVar11 = local_12c0._8_4_;
          fVar165 = auVar20._8_4_ + fVar11;
          fVar86 = local_12c0._12_4_;
          fVar166 = auVar20._12_4_ + fVar86;
          fVar88 = local_12c0._16_4_;
          fVar167 = auVar20._16_4_ + fVar88;
          fVar12 = local_12c0._20_4_;
          fVar168 = auVar20._20_4_ + fVar12;
          fVar14 = local_12c0._24_4_;
          fVar169 = auVar20._24_4_ + fVar14;
          fVar141 = local_12c0._28_4_;
          fVar121 = auVar20._28_4_;
          fVar199 = local_1340._0_4_;
          fVar202 = local_1340._4_4_;
          auVar16._4_4_ = fVar202 * fVar134;
          auVar16._0_4_ = fVar199 * fVar129;
          fVar204 = local_1340._8_4_;
          auVar16._8_4_ = fVar204 * fVar135;
          fVar206 = local_1340._12_4_;
          auVar16._12_4_ = fVar206 * fVar136;
          fVar208 = local_1340._16_4_;
          auVar16._16_4_ = fVar208 * fVar137;
          fVar210 = local_1340._20_4_;
          auVar16._20_4_ = fVar210 * fVar138;
          fVar212 = local_1340._24_4_;
          auVar16._24_4_ = fVar212 * fVar139;
          auVar16._28_4_ = uVar74;
          fVar226 = local_1320._0_4_;
          fVar228 = local_1320._4_4_;
          auVar17._4_4_ = fVar228 * fVar164;
          auVar17._0_4_ = fVar226 * fVar159;
          fVar229 = local_1320._8_4_;
          auVar17._8_4_ = fVar229 * fVar165;
          fVar230 = local_1320._12_4_;
          auVar17._12_4_ = fVar230 * fVar166;
          fVar231 = local_1320._16_4_;
          auVar17._16_4_ = fVar231 * fVar167;
          fVar232 = local_1320._20_4_;
          auVar17._20_4_ = fVar232 * fVar168;
          fVar233 = local_1320._24_4_;
          auVar17._24_4_ = fVar233 * fVar169;
          auVar17._28_4_ = uVar1;
          auVar16 = vsubps_avx(auVar17,auVar16);
          fVar140 = local_12a0._0_4_;
          fVar170 = fVar140 + auVar76._0_4_;
          fVar147 = local_12a0._4_4_;
          fVar174 = fVar147 + auVar76._4_4_;
          fVar149 = local_12a0._8_4_;
          fVar175 = fVar149 + auVar76._8_4_;
          fVar151 = local_12a0._12_4_;
          fVar176 = fVar151 + auVar76._12_4_;
          fVar153 = local_12a0._16_4_;
          fVar177 = fVar153 + auVar76._16_4_;
          fVar155 = local_12a0._20_4_;
          fVar178 = fVar155 + auVar76._20_4_;
          fVar157 = local_12a0._24_4_;
          fVar179 = fVar157 + auVar76._24_4_;
          fVar215 = local_1300._0_4_;
          fVar218 = local_1300._4_4_;
          auVar21._4_4_ = fVar218 * fVar164;
          auVar21._0_4_ = fVar215 * fVar159;
          fVar220 = local_1300._8_4_;
          auVar21._8_4_ = fVar220 * fVar165;
          fVar221 = local_1300._12_4_;
          auVar21._12_4_ = fVar221 * fVar166;
          fVar222 = local_1300._16_4_;
          auVar21._16_4_ = fVar222 * fVar167;
          fVar223 = local_1300._20_4_;
          auVar21._20_4_ = fVar223 * fVar168;
          fVar224 = local_1300._24_4_;
          auVar21._24_4_ = fVar224 * fVar169;
          auVar21._28_4_ = fVar121 + fVar141;
          auVar15._4_4_ = fVar202 * fVar174;
          auVar15._0_4_ = fVar199 * fVar170;
          auVar15._8_4_ = fVar204 * fVar175;
          auVar15._12_4_ = fVar206 * fVar176;
          auVar15._16_4_ = fVar208 * fVar177;
          auVar15._20_4_ = fVar210 * fVar178;
          auVar15._24_4_ = fVar212 * fVar179;
          auVar15._28_4_ = local_1340._28_4_;
          auVar17 = vsubps_avx(auVar15,auVar21);
          auVar18._4_4_ = fVar228 * fVar174;
          auVar18._0_4_ = fVar226 * fVar170;
          auVar18._8_4_ = fVar229 * fVar175;
          auVar18._12_4_ = fVar230 * fVar176;
          auVar18._16_4_ = fVar231 * fVar177;
          auVar18._20_4_ = fVar232 * fVar178;
          auVar18._24_4_ = fVar233 * fVar179;
          auVar18._28_4_ = local_12a0._28_4_ + auVar76._28_4_;
          auVar22._4_4_ = fVar218 * fVar134;
          auVar22._0_4_ = fVar215 * fVar129;
          auVar22._8_4_ = fVar220 * fVar135;
          auVar22._12_4_ = fVar221 * fVar136;
          auVar22._16_4_ = fVar222 * fVar137;
          auVar22._20_4_ = fVar223 * fVar138;
          auVar22._24_4_ = fVar224 * fVar139;
          auVar22._28_4_ = auVar143._28_4_ + local_12e0._28_4_;
          auVar21 = vsubps_avx(auVar22,auVar18);
          local_1440._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_fc0 = (ray->super_RayK<1>).dir.field_0.m128[2];
          fVar129 = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_1380._4_4_ = fVar129;
          local_1380._0_4_ = fVar129;
          local_1380._8_4_ = fVar129;
          local_1380._12_4_ = fVar129;
          local_1380._16_4_ = fVar129;
          local_1380._20_4_ = fVar129;
          local_1380._24_4_ = fVar129;
          local_1380._28_4_ = fVar129;
          local_11c0._0_4_ =
               auVar16._0_4_ * fVar129 +
               local_1440._4_4_ * auVar17._0_4_ + local_fc0 * auVar21._0_4_;
          local_11c0._4_4_ =
               auVar16._4_4_ * fVar129 +
               local_1440._4_4_ * auVar17._4_4_ + local_fc0 * auVar21._4_4_;
          local_11c0._8_4_ =
               auVar16._8_4_ * fVar129 +
               local_1440._4_4_ * auVar17._8_4_ + local_fc0 * auVar21._8_4_;
          local_11c0._12_4_ =
               auVar16._12_4_ * fVar129 +
               local_1440._4_4_ * auVar17._12_4_ + local_fc0 * auVar21._12_4_;
          auVar160._16_4_ =
               auVar16._16_4_ * fVar129 +
               local_1440._4_4_ * auVar17._16_4_ + local_fc0 * auVar21._16_4_;
          auVar160._0_16_ = local_11c0;
          auVar160._20_4_ =
               auVar16._20_4_ * fVar129 +
               local_1440._4_4_ * auVar17._20_4_ + local_fc0 * auVar21._20_4_;
          auVar161._24_4_ =
               auVar16._24_4_ * fVar129 +
               local_1440._4_4_ * auVar17._24_4_ + local_fc0 * auVar21._24_4_;
          auVar161._0_24_ = auVar160;
          auVar161._28_4_ = auVar16._28_4_ + local_1300._28_4_ + auVar21._28_4_;
          local_fe0 = vsubps_avx(local_12e0,auVar118);
          local_1000 = vsubps_avx(local_12c0,auVar19);
          fVar174 = fVar6 + auVar118._0_4_;
          fVar175 = fVar8 + auVar118._4_4_;
          fVar176 = fVar10 + auVar118._8_4_;
          fVar177 = fVar85 + auVar118._12_4_;
          fVar178 = fVar87 + auVar118._16_4_;
          fVar179 = fVar89 + auVar118._20_4_;
          fVar225 = fVar13 + auVar118._24_4_;
          fVar164 = auVar19._0_4_ + fVar7;
          fVar165 = auVar19._4_4_ + fVar9;
          fVar166 = auVar19._8_4_ + fVar11;
          fVar167 = auVar19._12_4_ + fVar86;
          fVar168 = auVar19._16_4_ + fVar88;
          fVar169 = auVar19._20_4_ + fVar12;
          fVar170 = auVar19._24_4_ + fVar14;
          fVar214 = auVar19._28_4_;
          fVar134 = local_1000._0_4_;
          fVar135 = local_1000._4_4_;
          auVar23._4_4_ = fVar175 * fVar135;
          auVar23._0_4_ = fVar174 * fVar134;
          fVar136 = local_1000._8_4_;
          auVar23._8_4_ = fVar176 * fVar136;
          fVar137 = local_1000._12_4_;
          auVar23._12_4_ = fVar177 * fVar137;
          fVar138 = local_1000._16_4_;
          auVar23._16_4_ = fVar178 * fVar138;
          fVar139 = local_1000._20_4_;
          auVar23._20_4_ = fVar179 * fVar139;
          fVar159 = local_1000._24_4_;
          auVar23._24_4_ = fVar225 * fVar159;
          auVar23._28_4_ = fVar214;
          fVar189 = local_fe0._0_4_;
          fVar193 = local_fe0._4_4_;
          auVar24._4_4_ = fVar193 * fVar165;
          auVar24._0_4_ = fVar189 * fVar164;
          fVar194 = local_fe0._8_4_;
          auVar24._8_4_ = fVar194 * fVar166;
          fVar195 = local_fe0._12_4_;
          auVar24._12_4_ = fVar195 * fVar167;
          fVar196 = local_fe0._16_4_;
          auVar24._16_4_ = fVar196 * fVar168;
          fVar197 = local_fe0._20_4_;
          auVar24._20_4_ = fVar197 * fVar169;
          fVar198 = local_fe0._24_4_;
          auVar24._24_4_ = fVar198 * fVar170;
          auVar24._28_4_ = fVar141;
          auVar16 = vsubps_avx(auVar24,auVar23);
          auVar17 = vsubps_avx(local_12a0,auVar95);
          fVar200 = auVar17._0_4_;
          fVar203 = auVar17._4_4_;
          auVar25._4_4_ = fVar203 * fVar165;
          auVar25._0_4_ = fVar200 * fVar164;
          fVar205 = auVar17._8_4_;
          auVar25._8_4_ = fVar205 * fVar166;
          fVar207 = auVar17._12_4_;
          auVar25._12_4_ = fVar207 * fVar167;
          fVar209 = auVar17._16_4_;
          auVar25._16_4_ = fVar209 * fVar168;
          fVar211 = auVar17._20_4_;
          auVar25._20_4_ = fVar211 * fVar169;
          fVar213 = auVar17._24_4_;
          auVar25._24_4_ = fVar213 * fVar170;
          auVar25._28_4_ = fVar214 + fVar141;
          fVar141 = fVar140 + auVar95._0_4_;
          fVar164 = fVar147 + auVar95._4_4_;
          fVar165 = fVar149 + auVar95._8_4_;
          fVar166 = fVar151 + auVar95._12_4_;
          fVar167 = fVar153 + auVar95._16_4_;
          fVar168 = fVar155 + auVar95._20_4_;
          fVar169 = fVar157 + auVar95._24_4_;
          auVar26._4_4_ = fVar164 * fVar135;
          auVar26._0_4_ = fVar141 * fVar134;
          auVar26._8_4_ = fVar165 * fVar136;
          auVar26._12_4_ = fVar166 * fVar137;
          auVar26._16_4_ = fVar167 * fVar138;
          auVar26._20_4_ = fVar168 * fVar139;
          uVar74 = local_1000._28_4_;
          auVar26._24_4_ = fVar169 * fVar159;
          auVar26._28_4_ = uVar74;
          auVar17 = vsubps_avx(auVar26,auVar25);
          auVar27._4_4_ = fVar193 * fVar164;
          auVar27._0_4_ = fVar189 * fVar141;
          auVar27._8_4_ = fVar194 * fVar165;
          auVar27._12_4_ = fVar195 * fVar166;
          auVar27._16_4_ = fVar196 * fVar167;
          auVar27._20_4_ = fVar197 * fVar168;
          auVar27._24_4_ = fVar198 * fVar169;
          auVar27._28_4_ = uVar74;
          auVar28._4_4_ = fVar203 * fVar175;
          auVar28._0_4_ = fVar200 * fVar174;
          auVar28._8_4_ = fVar205 * fVar176;
          auVar28._12_4_ = fVar207 * fVar177;
          auVar28._16_4_ = fVar209 * fVar178;
          auVar28._20_4_ = fVar211 * fVar179;
          auVar28._24_4_ = fVar213 * fVar225;
          auVar28._28_4_ = local_12a0._28_4_ + auVar95._28_4_;
          auVar21 = vsubps_avx(auVar28,auVar27);
          local_1040._0_4_ =
               fVar129 * auVar16._0_4_ +
               local_1440._4_4_ * auVar17._0_4_ + local_fc0 * auVar21._0_4_;
          local_1040._4_4_ =
               fVar129 * auVar16._4_4_ +
               local_1440._4_4_ * auVar17._4_4_ + local_fc0 * auVar21._4_4_;
          local_1040._8_4_ =
               fVar129 * auVar16._8_4_ +
               local_1440._4_4_ * auVar17._8_4_ + local_fc0 * auVar21._8_4_;
          local_1040._12_4_ =
               fVar129 * auVar16._12_4_ +
               local_1440._4_4_ * auVar17._12_4_ + local_fc0 * auVar21._12_4_;
          local_1040._16_4_ =
               fVar129 * auVar16._16_4_ +
               local_1440._4_4_ * auVar17._16_4_ + local_fc0 * auVar21._16_4_;
          local_1040._20_4_ =
               fVar129 * auVar16._20_4_ +
               local_1440._4_4_ * auVar17._20_4_ + local_fc0 * auVar21._20_4_;
          local_1040._24_4_ =
               fVar129 * auVar16._24_4_ +
               local_1440._4_4_ * auVar17._24_4_ + local_fc0 * auVar21._24_4_;
          local_1040._28_4_ = auVar16._28_4_ + auVar17._28_4_ + auVar21._28_4_;
          auVar17 = vsubps_avx(auVar95,auVar76);
          fVar141 = auVar95._0_4_ + auVar76._0_4_;
          fVar164 = auVar95._4_4_ + auVar76._4_4_;
          fVar165 = auVar95._8_4_ + auVar76._8_4_;
          fVar166 = auVar95._12_4_ + auVar76._12_4_;
          fVar167 = auVar95._16_4_ + auVar76._16_4_;
          fVar168 = auVar95._20_4_ + auVar76._20_4_;
          fVar169 = auVar95._24_4_ + auVar76._24_4_;
          auVar21 = vsubps_avx(auVar118,auVar143);
          fVar170 = auVar118._0_4_ + auVar143._0_4_;
          fVar174 = auVar118._4_4_ + auVar143._4_4_;
          fVar175 = auVar118._8_4_ + auVar143._8_4_;
          fVar176 = auVar118._12_4_ + auVar143._12_4_;
          fVar177 = auVar118._16_4_ + auVar143._16_4_;
          fVar178 = auVar118._20_4_ + auVar143._20_4_;
          fVar179 = auVar118._24_4_ + auVar143._24_4_;
          fVar225 = auVar118._28_4_ + auVar143._28_4_;
          auVar118 = vsubps_avx(auVar19,auVar20);
          fVar90 = auVar19._0_4_ + auVar20._0_4_;
          fVar97 = auVar19._4_4_ + auVar20._4_4_;
          fVar98 = auVar19._8_4_ + auVar20._8_4_;
          fVar99 = auVar19._12_4_ + auVar20._12_4_;
          fVar100 = auVar19._16_4_ + auVar20._16_4_;
          fVar101 = auVar19._20_4_ + auVar20._20_4_;
          fVar102 = auVar19._24_4_ + auVar20._24_4_;
          fVar142 = auVar118._0_4_;
          fVar148 = auVar118._4_4_;
          auVar20._4_4_ = fVar148 * fVar174;
          auVar20._0_4_ = fVar142 * fVar170;
          fVar150 = auVar118._8_4_;
          auVar20._8_4_ = fVar150 * fVar175;
          fVar152 = auVar118._12_4_;
          auVar20._12_4_ = fVar152 * fVar176;
          fVar154 = auVar118._16_4_;
          auVar20._16_4_ = fVar154 * fVar177;
          fVar156 = auVar118._20_4_;
          auVar20._20_4_ = fVar156 * fVar178;
          fVar158 = auVar118._24_4_;
          auVar20._24_4_ = fVar158 * fVar179;
          auVar20._28_4_ = auVar16._28_4_;
          fVar180 = auVar21._0_4_;
          fVar183 = auVar21._4_4_;
          auVar29._4_4_ = fVar183 * fVar97;
          auVar29._0_4_ = fVar180 * fVar90;
          fVar184 = auVar21._8_4_;
          auVar29._8_4_ = fVar184 * fVar98;
          fVar185 = auVar21._12_4_;
          auVar29._12_4_ = fVar185 * fVar99;
          fVar186 = auVar21._16_4_;
          auVar29._16_4_ = fVar186 * fVar100;
          fVar187 = auVar21._20_4_;
          auVar29._20_4_ = fVar187 * fVar101;
          fVar188 = auVar21._24_4_;
          auVar29._24_4_ = fVar188 * fVar102;
          auVar29._28_4_ = fVar121;
          auVar118 = vsubps_avx(auVar29,auVar20);
          fVar216 = auVar17._0_4_;
          fVar219 = auVar17._4_4_;
          auVar30._4_4_ = fVar219 * fVar97;
          auVar30._0_4_ = fVar216 * fVar90;
          fVar90 = auVar17._8_4_;
          auVar30._8_4_ = fVar90 * fVar98;
          fVar97 = auVar17._12_4_;
          auVar30._12_4_ = fVar97 * fVar99;
          fVar98 = auVar17._16_4_;
          auVar30._16_4_ = fVar98 * fVar100;
          fVar99 = auVar17._20_4_;
          auVar30._20_4_ = fVar99 * fVar101;
          fVar100 = auVar17._24_4_;
          auVar30._24_4_ = fVar100 * fVar102;
          auVar30._28_4_ = fVar214 + fVar121;
          auVar31._4_4_ = fVar148 * fVar164;
          auVar31._0_4_ = fVar142 * fVar141;
          auVar31._8_4_ = fVar150 * fVar165;
          auVar31._12_4_ = fVar152 * fVar166;
          auVar31._16_4_ = fVar154 * fVar167;
          auVar31._20_4_ = fVar156 * fVar168;
          auVar31._24_4_ = fVar158 * fVar169;
          auVar31._28_4_ = fVar121;
          auVar143 = vsubps_avx(auVar31,auVar30);
          auVar32._4_4_ = fVar183 * fVar164;
          auVar32._0_4_ = fVar180 * fVar141;
          auVar32._8_4_ = fVar184 * fVar165;
          auVar32._12_4_ = fVar185 * fVar166;
          auVar32._16_4_ = fVar186 * fVar167;
          auVar32._20_4_ = fVar187 * fVar168;
          auVar32._24_4_ = fVar188 * fVar169;
          auVar32._28_4_ = auVar95._28_4_ + auVar76._28_4_;
          auVar33._4_4_ = fVar219 * fVar174;
          auVar33._0_4_ = fVar216 * fVar170;
          auVar33._8_4_ = fVar90 * fVar175;
          auVar33._12_4_ = fVar97 * fVar176;
          auVar33._16_4_ = fVar98 * fVar177;
          auVar33._20_4_ = fVar99 * fVar178;
          auVar33._24_4_ = fVar100 * fVar179;
          auVar33._28_4_ = fVar225;
          auVar95 = vsubps_avx(auVar33,auVar32);
          fStack_fbc = local_fc0;
          fStack_fb8 = local_fc0;
          fStack_fb4 = local_fc0;
          fStack_fb0 = local_fc0;
          fStack_fac = local_fc0;
          fStack_fa8 = local_fc0;
          fStack_fa4 = local_fc0;
          local_1440._0_4_ = local_1440._4_4_;
          fStack_1438 = local_1440._4_4_;
          fStack_1434 = local_1440._4_4_;
          fStack_1430 = local_1440._4_4_;
          fStack_142c = local_1440._4_4_;
          fStack_1428 = local_1440._4_4_;
          fStack_1424 = local_1440._4_4_;
          auVar77._0_4_ =
               fVar129 * auVar118._0_4_ +
               local_1440._4_4_ * auVar143._0_4_ + local_fc0 * auVar95._0_4_;
          auVar77._4_4_ =
               fVar129 * auVar118._4_4_ +
               local_1440._4_4_ * auVar143._4_4_ + local_fc0 * auVar95._4_4_;
          auVar77._8_4_ =
               fVar129 * auVar118._8_4_ +
               local_1440._4_4_ * auVar143._8_4_ + local_fc0 * auVar95._8_4_;
          auVar77._12_4_ =
               fVar129 * auVar118._12_4_ +
               local_1440._4_4_ * auVar143._12_4_ + local_fc0 * auVar95._12_4_;
          auVar77._16_4_ =
               fVar129 * auVar118._16_4_ +
               local_1440._4_4_ * auVar143._16_4_ + local_fc0 * auVar95._16_4_;
          auVar77._20_4_ =
               fVar129 * auVar118._20_4_ +
               local_1440._4_4_ * auVar143._20_4_ + local_fc0 * auVar95._20_4_;
          auVar77._24_4_ =
               fVar129 * auVar118._24_4_ +
               local_1440._4_4_ * auVar143._24_4_ + local_fc0 * auVar95._24_4_;
          auVar77._28_4_ = fVar225 + fVar225 + auVar95._28_4_;
          local_1180._0_4_ = auVar77._0_4_ + local_11c0._0_4_ + local_1040._0_4_;
          local_1180._4_4_ = auVar77._4_4_ + local_11c0._4_4_ + local_1040._4_4_;
          local_1180._8_4_ = auVar77._8_4_ + local_11c0._8_4_ + local_1040._8_4_;
          local_1180._12_4_ = auVar77._12_4_ + local_11c0._12_4_ + local_1040._12_4_;
          local_1180._16_4_ = auVar77._16_4_ + auVar160._16_4_ + local_1040._16_4_;
          local_1180._20_4_ = auVar77._20_4_ + auVar160._20_4_ + local_1040._20_4_;
          local_1180._24_4_ = auVar77._24_4_ + auVar161._24_4_ + local_1040._24_4_;
          local_1180._28_4_ = auVar77._28_4_ + auVar161._28_4_ + local_1040._28_4_;
          auVar81._8_4_ = 0x7fffffff;
          auVar81._0_8_ = 0x7fffffff7fffffff;
          auVar81._12_4_ = 0x7fffffff;
          auVar81._16_4_ = 0x7fffffff;
          auVar81._20_4_ = 0x7fffffff;
          auVar81._24_4_ = 0x7fffffff;
          auVar81._28_4_ = 0x7fffffff;
          auVar95 = vandps_avx(local_1180,auVar81);
          fVar141 = auVar95._0_4_ * 1.1920929e-07;
          fVar164 = auVar95._4_4_ * 1.1920929e-07;
          auVar34._4_4_ = fVar164;
          auVar34._0_4_ = fVar141;
          fVar165 = auVar95._8_4_ * 1.1920929e-07;
          auVar34._8_4_ = fVar165;
          fVar166 = auVar95._12_4_ * 1.1920929e-07;
          auVar34._12_4_ = fVar166;
          fVar167 = auVar95._16_4_ * 1.1920929e-07;
          auVar34._16_4_ = fVar167;
          fVar168 = auVar95._20_4_ * 1.1920929e-07;
          auVar34._20_4_ = fVar168;
          uVar64 = auVar95._28_4_;
          fVar169 = auVar95._24_4_ * 1.1920929e-07;
          auVar34._24_4_ = fVar169;
          auVar34._28_4_ = uVar64;
          auVar95 = vminps_avx(auVar161,local_1040);
          auVar95 = vminps_avx(auVar95,auVar77);
          auVar106._0_8_ = CONCAT44(fVar164,fVar141) ^ 0x8000000080000000;
          auVar106._8_4_ = -fVar165;
          auVar106._12_4_ = -fVar166;
          auVar106._16_4_ = -fVar167;
          auVar106._20_4_ = -fVar168;
          auVar106._24_4_ = -fVar169;
          auVar106._28_4_ = uVar64 ^ 0x80000000;
          auVar95 = vcmpps_avx(auVar95,auVar106,5);
          local_1020 = auVar161;
          auVar20 = local_1020;
          auVar118 = vmaxps_avx(auVar161,local_1040);
          auVar76 = vmaxps_avx(auVar118,auVar77);
          auVar76 = vcmpps_avx(auVar76,auVar34,2);
          auVar143 = vorps_avx(auVar95,auVar76);
          local_1398 = (undefined1 (*) [16])(lVar62 + 0x2c + uVar73 * 0xc);
          uVar3 = *(uint *)(local_1458 + 0x18);
          uVar73 = CONCAT44(0,uVar3);
          uVar71 = *(uint *)(local_1458 + 0x1c);
          local_1160 = &local_1398;
          auVar19._8_8_ = local_1080[1]._8_8_;
          auVar19._0_8_ = local_1080[1]._0_8_;
          auVar19._16_8_ = local_1080[1]._16_8_;
          auVar19._24_8_ = local_1080[1]._24_8_;
          auVar19 = auVar19 & auVar143;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0x7f,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0xbf,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar19[0x1f] < '\0') {
            auVar35._4_4_ = fVar202 * fVar193;
            auVar35._0_4_ = fVar199 * fVar189;
            auVar35._8_4_ = fVar204 * fVar194;
            auVar35._12_4_ = fVar206 * fVar195;
            auVar35._16_4_ = fVar208 * fVar196;
            auVar35._20_4_ = fVar210 * fVar197;
            auVar35._24_4_ = fVar212 * fVar198;
            auVar35._28_4_ = auVar76._28_4_;
            auVar36._4_4_ = fVar228 * fVar135;
            auVar36._0_4_ = fVar226 * fVar134;
            auVar36._8_4_ = fVar229 * fVar136;
            auVar36._12_4_ = fVar230 * fVar137;
            auVar36._16_4_ = fVar231 * fVar138;
            auVar36._20_4_ = fVar232 * fVar139;
            auVar36._24_4_ = fVar233 * fVar159;
            auVar36._28_4_ = uVar64;
            auVar19 = vsubps_avx(auVar36,auVar35);
            auVar37._4_4_ = fVar183 * fVar135;
            auVar37._0_4_ = fVar180 * fVar134;
            auVar37._8_4_ = fVar184 * fVar136;
            auVar37._12_4_ = fVar185 * fVar137;
            auVar37._16_4_ = fVar186 * fVar138;
            auVar37._20_4_ = fVar187 * fVar139;
            auVar37._24_4_ = fVar188 * fVar159;
            auVar37._28_4_ = auVar95._28_4_;
            auVar38._4_4_ = fVar193 * fVar148;
            auVar38._0_4_ = fVar189 * fVar142;
            auVar38._8_4_ = fVar194 * fVar150;
            auVar38._12_4_ = fVar195 * fVar152;
            auVar38._16_4_ = fVar196 * fVar154;
            auVar38._20_4_ = fVar197 * fVar156;
            auVar38._24_4_ = fVar198 * fVar158;
            auVar38._28_4_ = auVar118._28_4_;
            auVar118 = vsubps_avx(auVar38,auVar37);
            auVar124._8_4_ = 0x7fffffff;
            auVar124._0_8_ = 0x7fffffff7fffffff;
            auVar124._12_4_ = 0x7fffffff;
            auVar124._16_4_ = 0x7fffffff;
            auVar124._20_4_ = 0x7fffffff;
            auVar124._24_4_ = 0x7fffffff;
            auVar124._28_4_ = 0x7fffffff;
            auVar95 = vandps_avx(auVar35,auVar124);
            auVar76 = vandps_avx(auVar37,auVar124);
            auVar95 = vcmpps_avx(auVar95,auVar76,1);
            local_10c0 = vblendvps_avx(auVar118,auVar19,auVar95);
            auVar39._4_4_ = fVar203 * fVar148;
            auVar39._0_4_ = fVar200 * fVar142;
            auVar39._8_4_ = fVar205 * fVar150;
            auVar39._12_4_ = fVar207 * fVar152;
            auVar39._16_4_ = fVar209 * fVar154;
            auVar39._20_4_ = fVar211 * fVar156;
            auVar39._24_4_ = fVar213 * fVar158;
            auVar39._28_4_ = auVar95._28_4_;
            auVar40._4_4_ = fVar202 * fVar203;
            auVar40._0_4_ = fVar199 * fVar200;
            auVar40._8_4_ = fVar204 * fVar205;
            auVar40._12_4_ = fVar206 * fVar207;
            auVar40._16_4_ = fVar208 * fVar209;
            auVar40._20_4_ = fVar210 * fVar211;
            auVar40._24_4_ = fVar212 * fVar213;
            auVar40._28_4_ = auVar19._28_4_;
            auVar41._4_4_ = fVar218 * fVar135;
            auVar41._0_4_ = fVar215 * fVar134;
            auVar41._8_4_ = fVar220 * fVar136;
            auVar41._12_4_ = fVar221 * fVar137;
            auVar41._16_4_ = fVar222 * fVar138;
            auVar41._20_4_ = fVar223 * fVar139;
            auVar41._24_4_ = fVar224 * fVar159;
            auVar41._28_4_ = auVar118._28_4_;
            auVar118 = vsubps_avx(auVar40,auVar41);
            auVar42._4_4_ = fVar219 * fVar135;
            auVar42._0_4_ = fVar216 * fVar134;
            auVar42._8_4_ = fVar90 * fVar136;
            auVar42._12_4_ = fVar97 * fVar137;
            auVar42._16_4_ = fVar98 * fVar138;
            auVar42._20_4_ = fVar99 * fVar139;
            auVar42._24_4_ = fVar100 * fVar159;
            auVar42._28_4_ = uVar74;
            auVar19 = vsubps_avx(auVar42,auVar39);
            auVar95 = vandps_avx(auVar41,auVar124);
            auVar76 = vandps_avx(auVar39,auVar124);
            auVar76 = vcmpps_avx(auVar95,auVar76,1);
            local_10a0 = vblendvps_avx(auVar19,auVar118,auVar76);
            auVar43._4_4_ = fVar193 * fVar219;
            auVar43._0_4_ = fVar189 * fVar216;
            auVar43._8_4_ = fVar194 * fVar90;
            auVar43._12_4_ = fVar195 * fVar97;
            auVar43._16_4_ = fVar196 * fVar98;
            auVar43._20_4_ = fVar197 * fVar99;
            auVar43._24_4_ = fVar198 * fVar100;
            auVar43._28_4_ = auVar76._28_4_;
            auVar44._4_4_ = fVar193 * fVar218;
            auVar44._0_4_ = fVar189 * fVar215;
            auVar44._8_4_ = fVar194 * fVar220;
            auVar44._12_4_ = fVar195 * fVar221;
            auVar44._16_4_ = fVar196 * fVar222;
            auVar44._20_4_ = fVar197 * fVar223;
            auVar44._24_4_ = fVar198 * fVar224;
            auVar44._28_4_ = auVar118._28_4_;
            auVar45._4_4_ = fVar203 * fVar228;
            auVar45._0_4_ = fVar200 * fVar226;
            auVar45._8_4_ = fVar205 * fVar229;
            auVar45._12_4_ = fVar207 * fVar230;
            auVar45._16_4_ = fVar209 * fVar231;
            auVar45._20_4_ = fVar211 * fVar232;
            auVar45._24_4_ = fVar213 * fVar233;
            auVar45._28_4_ = auVar95._28_4_;
            auVar46._4_4_ = fVar203 * fVar183;
            auVar46._0_4_ = fVar200 * fVar180;
            auVar46._8_4_ = fVar205 * fVar184;
            auVar46._12_4_ = fVar207 * fVar185;
            auVar46._16_4_ = fVar209 * fVar186;
            auVar46._20_4_ = fVar211 * fVar187;
            auVar46._24_4_ = fVar213 * fVar188;
            auVar46._28_4_ = local_1300._28_4_;
            auVar118 = vsubps_avx(auVar44,auVar45);
            auVar19 = vsubps_avx(auVar46,auVar43);
            auVar95 = vandps_avx(auVar45,auVar124);
            auVar76 = vandps_avx(auVar43,auVar124);
            auVar76 = vcmpps_avx(auVar95,auVar76,1);
            local_1080[0] = vblendvps_avx(auVar19,auVar118,auVar76);
            fVar141 = local_10c0._0_4_ * fVar129 +
                      local_10a0._0_4_ * local_1440._4_4_ + local_1080[0]._0_4_ * local_fc0;
            fVar134 = local_10c0._4_4_ * fVar129 +
                      local_10a0._4_4_ * local_1440._4_4_ + local_1080[0]._4_4_ * local_fc0;
            fVar135 = local_10c0._8_4_ * fVar129 +
                      local_10a0._8_4_ * local_1440._4_4_ + local_1080[0]._8_4_ * local_fc0;
            fVar136 = local_10c0._12_4_ * fVar129 +
                      local_10a0._12_4_ * local_1440._4_4_ + local_1080[0]._12_4_ * local_fc0;
            fVar137 = local_10c0._16_4_ * fVar129 +
                      local_10a0._16_4_ * local_1440._4_4_ + local_1080[0]._16_4_ * local_fc0;
            fVar138 = local_10c0._20_4_ * fVar129 +
                      local_10a0._20_4_ * local_1440._4_4_ + local_1080[0]._20_4_ * local_fc0;
            fVar129 = local_10c0._24_4_ * fVar129 +
                      local_10a0._24_4_ * local_1440._4_4_ + local_1080[0]._24_4_ * local_fc0;
            fVar139 = auVar95._28_4_ + auVar95._28_4_ + auVar118._28_4_;
            auVar107._0_4_ = fVar141 + fVar141;
            auVar107._4_4_ = fVar134 + fVar134;
            auVar107._8_4_ = fVar135 + fVar135;
            auVar107._12_4_ = fVar136 + fVar136;
            auVar107._16_4_ = fVar137 + fVar137;
            auVar107._20_4_ = fVar138 + fVar138;
            auVar107._24_4_ = fVar129 + fVar129;
            auVar107._28_4_ = fVar139 + fVar139;
            fVar141 = auVar19._28_4_;
            auVar95 = vrcpps_avx(auVar107);
            fVar134 = local_10c0._0_4_ * fVar140 +
                      local_10a0._0_4_ * fVar6 + local_1080[0]._0_4_ * fVar7;
            fVar135 = local_10c0._4_4_ * fVar147 +
                      local_10a0._4_4_ * fVar8 + local_1080[0]._4_4_ * fVar9;
            fVar136 = local_10c0._8_4_ * fVar149 +
                      local_10a0._8_4_ * fVar10 + local_1080[0]._8_4_ * fVar11;
            fVar85 = local_10c0._12_4_ * fVar151 +
                     local_10a0._12_4_ * fVar85 + local_1080[0]._12_4_ * fVar86;
            fVar86 = local_10c0._16_4_ * fVar153 +
                     local_10a0._16_4_ * fVar87 + local_1080[0]._16_4_ * fVar88;
            fVar87 = local_10c0._20_4_ * fVar155 +
                     local_10a0._20_4_ * fVar89 + local_1080[0]._20_4_ * fVar12;
            fVar88 = local_10c0._24_4_ * fVar157 +
                     local_10a0._24_4_ * fVar13 + local_1080[0]._24_4_ * fVar14;
            fVar89 = fVar141 + fVar141 + fVar139;
            fVar129 = auVar95._0_4_;
            fVar6 = auVar95._4_4_;
            auVar47._4_4_ = auVar107._4_4_ * fVar6;
            auVar47._0_4_ = auVar107._0_4_ * fVar129;
            fVar7 = auVar95._8_4_;
            auVar47._8_4_ = auVar107._8_4_ * fVar7;
            fVar8 = auVar95._12_4_;
            auVar47._12_4_ = auVar107._12_4_ * fVar8;
            fVar9 = auVar95._16_4_;
            auVar47._16_4_ = auVar107._16_4_ * fVar9;
            fVar10 = auVar95._20_4_;
            auVar47._20_4_ = auVar107._20_4_ * fVar10;
            fVar11 = auVar95._24_4_;
            auVar47._24_4_ = auVar107._24_4_ * fVar11;
            auVar47._28_4_ = fVar141;
            auVar131._8_4_ = 0x3f800000;
            auVar131._0_8_ = &DAT_3f8000003f800000;
            auVar131._12_4_ = 0x3f800000;
            auVar131._16_4_ = 0x3f800000;
            auVar131._20_4_ = 0x3f800000;
            auVar131._24_4_ = 0x3f800000;
            auVar131._28_4_ = 0x3f800000;
            auVar95 = vsubps_avx(auVar131,auVar47);
            uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar125._4_4_ = uVar74;
            auVar125._0_4_ = uVar74;
            auVar125._8_4_ = uVar74;
            auVar125._12_4_ = uVar74;
            auVar125._16_4_ = uVar74;
            auVar125._20_4_ = uVar74;
            auVar125._24_4_ = uVar74;
            auVar125._28_4_ = uVar74;
            local_10e0._4_4_ = (fVar135 + fVar135) * (fVar6 + fVar6 * auVar95._4_4_);
            local_10e0._0_4_ = (fVar134 + fVar134) * (fVar129 + fVar129 * auVar95._0_4_);
            local_10e0._8_4_ = (fVar136 + fVar136) * (fVar7 + fVar7 * auVar95._8_4_);
            local_10e0._12_4_ = (fVar85 + fVar85) * (fVar8 + fVar8 * auVar95._12_4_);
            local_10e0._16_4_ = (fVar86 + fVar86) * (fVar9 + fVar9 * auVar95._16_4_);
            local_10e0._20_4_ = (fVar87 + fVar87) * (fVar10 + fVar10 * auVar95._20_4_);
            local_10e0._24_4_ = (fVar88 + fVar88) * (fVar11 + fVar11 * auVar95._24_4_);
            local_10e0._28_4_ = fVar89 + fVar89;
            auVar95 = vcmpps_avx(auVar125,local_10e0,2);
            fVar129 = (ray->super_RayK<1>).tfar;
            auVar126._4_4_ = fVar129;
            auVar126._0_4_ = fVar129;
            auVar126._8_4_ = fVar129;
            auVar126._12_4_ = fVar129;
            auVar126._16_4_ = fVar129;
            auVar126._20_4_ = fVar129;
            auVar126._24_4_ = fVar129;
            auVar126._28_4_ = fVar129;
            auVar76 = vcmpps_avx(local_10e0,auVar126,2);
            auVar95 = vandps_avx(auVar95,auVar76);
            auVar76 = vcmpps_avx(auVar107,_DAT_02020f00,4);
            auVar95 = vandps_avx(auVar76,auVar95);
            auVar116 = vpslld_avx(auVar95._0_16_,0x1f);
            auVar117 = vpsrad_avx(auVar116,0x1f);
            auVar116 = vpslld_avx(auVar95._16_16_,0x1f);
            auVar116 = vpsrad_avx(auVar116,0x1f);
            auVar108._16_16_ = auVar116;
            auVar108._0_16_ = auVar117;
            auVar59._8_8_ = local_1080[1]._8_8_;
            auVar59._0_8_ = local_1080[1]._0_8_;
            auVar59._16_8_ = local_1080[1]._16_8_;
            auVar59._24_8_ = local_1080[1]._24_8_;
            auVar95 = vandps_avx(auVar143,auVar59);
            auVar76 = auVar95 & auVar108;
            if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar76 >> 0x7f,0) != '\0') ||
                  (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar76 >> 0xbf,0) != '\0') ||
                (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar76[0x1f] < '\0') {
              auVar95 = vandps_avx(auVar108,auVar95);
              local_1020._16_8_ = auVar160._16_8_;
              local_1020._24_8_ = auVar161._24_8_;
              uStack_11b0 = local_1020._16_8_;
              uStack_11a8 = local_1020._24_8_;
              local_11a0 = local_1040;
              local_1160 = &local_1398;
              local_1140 = auVar95;
              pGVar63 = (context->scene->geometries).items[uVar73].ptr;
              if ((pGVar63->mask & (ray->super_RayK<1>).mask) != 0) {
                local_1440 = pGVar63;
                local_1280 = auVar95;
                auVar96._8_4_ = 0x7fffffff;
                auVar96._0_8_ = 0x7fffffff7fffffff;
                auVar96._12_4_ = 0x7fffffff;
                auVar96._16_4_ = 0x7fffffff;
                auVar96._20_4_ = 0x7fffffff;
                auVar96._24_4_ = 0x7fffffff;
                auVar96._28_4_ = 0x7fffffff;
                auVar76 = vandps_avx(local_1180,auVar96);
                auVar109._8_4_ = 0x219392ef;
                auVar109._0_8_ = 0x219392ef219392ef;
                auVar109._12_4_ = 0x219392ef;
                auVar109._16_4_ = 0x219392ef;
                auVar109._20_4_ = 0x219392ef;
                auVar109._24_4_ = 0x219392ef;
                auVar109._28_4_ = 0x219392ef;
                auVar76 = vcmpps_avx(auVar76,auVar109,5);
                auVar118 = vrcpps_avx(local_1180);
                fVar129 = auVar118._0_4_;
                fVar6 = auVar118._4_4_;
                auVar48._4_4_ = local_1180._4_4_ * fVar6;
                auVar48._0_4_ = local_1180._0_4_ * fVar129;
                fVar7 = auVar118._8_4_;
                auVar48._8_4_ = local_1180._8_4_ * fVar7;
                fVar8 = auVar118._12_4_;
                auVar48._12_4_ = local_1180._12_4_ * fVar8;
                fVar9 = auVar118._16_4_;
                auVar48._16_4_ = local_1180._16_4_ * fVar9;
                fVar10 = auVar118._20_4_;
                auVar48._20_4_ = local_1180._20_4_ * fVar10;
                fVar11 = auVar118._24_4_;
                auVar48._24_4_ = local_1180._24_4_ * fVar11;
                auVar48._28_4_ = local_1180._28_4_;
                auVar112._8_4_ = 0x3f800000;
                auVar112._0_8_ = &DAT_3f8000003f800000;
                auVar112._12_4_ = 0x3f800000;
                auVar112._16_4_ = 0x3f800000;
                auVar112._20_4_ = 0x3f800000;
                auVar112._24_4_ = 0x3f800000;
                auVar112._28_4_ = 0x3f800000;
                auVar143 = vsubps_avx(auVar112,auVar48);
                auVar82._0_4_ = fVar129 + fVar129 * auVar143._0_4_;
                auVar82._4_4_ = fVar6 + fVar6 * auVar143._4_4_;
                auVar82._8_4_ = fVar7 + fVar7 * auVar143._8_4_;
                auVar82._12_4_ = fVar8 + fVar8 * auVar143._12_4_;
                auVar82._16_4_ = fVar9 + fVar9 * auVar143._16_4_;
                auVar82._20_4_ = fVar10 + fVar10 * auVar143._20_4_;
                auVar82._24_4_ = fVar11 + fVar11 * auVar143._24_4_;
                auVar82._28_4_ = auVar118._28_4_ + auVar143._28_4_;
                auVar76 = vandps_avx(auVar76,auVar82);
                auVar49._4_4_ = auVar76._4_4_ * local_11c0._4_4_;
                auVar49._0_4_ = auVar76._0_4_ * local_11c0._0_4_;
                auVar49._8_4_ = auVar76._8_4_ * local_11c0._8_4_;
                auVar49._12_4_ = auVar76._12_4_ * local_11c0._12_4_;
                auVar49._16_4_ = auVar76._16_4_ * auVar160._16_4_;
                auVar49._20_4_ = auVar76._20_4_ * auVar160._20_4_;
                auVar49._24_4_ = auVar76._24_4_ * auVar161._24_4_;
                auVar49._28_4_ = auVar82._28_4_;
                auVar118 = vminps_avx(auVar49,auVar112);
                auVar50._4_4_ = auVar76._4_4_ * local_1040._4_4_;
                auVar50._0_4_ = auVar76._0_4_ * local_1040._0_4_;
                auVar50._8_4_ = auVar76._8_4_ * local_1040._8_4_;
                auVar50._12_4_ = auVar76._12_4_ * local_1040._12_4_;
                auVar50._16_4_ = auVar76._16_4_ * local_1040._16_4_;
                auVar50._20_4_ = auVar76._20_4_ * local_1040._20_4_;
                auVar50._24_4_ = auVar76._24_4_ * local_1040._24_4_;
                auVar50._28_4_ = auVar76._28_4_;
                auVar76 = vminps_avx(auVar50,auVar112);
                auVar116 = *(undefined1 (*) [16])(*local_1398 + local_1390 * 4);
                auVar117 = auVar116;
                if (2 < local_1388) {
                  auVar117 = *(undefined1 (*) [16])(*local_1398 + local_1390 * 8);
                }
                auVar130 = *local_1398;
                if (local_1390 == 2) {
                  auVar130 = vpshufd_avx(auVar130,0x54);
                  auVar116 = vpshufd_avx(auVar116,0x54);
                  auVar117 = vpshufd_avx(auVar117,0x54);
                }
                auVar127._16_16_ = auVar116;
                auVar127._0_16_ = auVar130;
                auVar132._16_16_ = auVar117;
                auVar132._0_16_ = auVar116;
                auVar143 = vunpcklps_avx(auVar127,auVar132);
                auVar130 = vpshufd_avx(auVar130,0xa5);
                auVar91 = vpshufd_avx(auVar116,0xa5);
                auVar145._16_16_ = auVar91;
                auVar145._0_16_ = auVar130;
                auVar116 = vpshufd_avx(auVar116,0x94);
                auVar117 = vpshufd_avx(auVar117,0x94);
                auVar162._16_16_ = auVar117;
                auVar162._0_16_ = auVar116;
                auVar172._0_16_ = vpsrld_avx(auVar143._0_16_,0x10);
                auVar181 = vpsrld_avx(auVar143._16_16_,0x10);
                auVar191._8_4_ = 0xffff;
                auVar191._0_8_ = 0xffff0000ffff;
                auVar191._12_4_ = 0xffff;
                auVar191._16_4_ = 0xffff;
                auVar191._20_4_ = 0xffff;
                auVar191._24_4_ = 0xffff;
                auVar191._28_4_ = 0xffff;
                auVar143 = vandps_avx(auVar191,auVar143);
                auVar19 = vcvtdq2ps_avx(auVar143);
                auVar172._16_16_ = auVar181;
                auVar16 = vcvtdq2ps_avx(auVar172);
                auVar119._0_16_ = vpsrld_avx(auVar130,0x10);
                auVar130 = vpsrld_avx(auVar91,0x10);
                auVar143 = vandps_avx(auVar145,auVar191);
                auVar17 = vcvtdq2ps_avx(auVar143);
                auVar119._16_16_ = auVar130;
                auVar21 = vcvtdq2ps_avx(auVar119);
                auVar110._0_16_ = vpsrld_avx(auVar116,0x10);
                auVar116 = vpsrld_avx(auVar117,0x10);
                auVar143 = vandps_avx(auVar162,auVar191);
                auVar143 = vcvtdq2ps_avx(auVar143);
                auVar110._16_16_ = auVar116;
                auVar15 = vcvtdq2ps_avx(auVar110);
                auVar120._8_4_ = 0x3f800000;
                auVar120._0_8_ = &DAT_3f8000003f800000;
                auVar120._12_4_ = 0x3f800000;
                auVar120._16_4_ = 0x3f800000;
                auVar120._20_4_ = 0x3f800000;
                auVar120._24_4_ = 0x3f800000;
                auVar120._28_4_ = 0x3f800000;
                auVar18 = vsubps_avx(auVar120,auVar118);
                auVar18 = vsubps_avx(auVar18,auVar76);
                local_1120[1] =
                     auVar76._4_4_ * auVar143._4_4_ * 0.00012207031 +
                     auVar17._4_4_ * 0.00012207031 * auVar118._4_4_ +
                     auVar18._4_4_ * auVar19._4_4_ * 0.00012207031;
                local_1120[0] =
                     auVar76._0_4_ * auVar143._0_4_ * 0.00012207031 +
                     auVar17._0_4_ * 0.00012207031 * auVar118._0_4_ +
                     auVar18._0_4_ * auVar19._0_4_ * 0.00012207031;
                local_1120[2] =
                     auVar76._8_4_ * auVar143._8_4_ * 0.00012207031 +
                     auVar17._8_4_ * 0.00012207031 * auVar118._8_4_ +
                     auVar18._8_4_ * auVar19._8_4_ * 0.00012207031;
                local_1120[3] =
                     auVar76._12_4_ * auVar143._12_4_ * 0.00012207031 +
                     auVar17._12_4_ * 0.00012207031 * auVar118._12_4_ +
                     auVar18._12_4_ * auVar19._12_4_ * 0.00012207031;
                fStack_1110 = auVar76._16_4_ * auVar143._16_4_ * 0.00012207031 +
                              auVar17._16_4_ * 0.00012207031 * auVar118._16_4_ +
                              auVar18._16_4_ * auVar19._16_4_ * 0.00012207031;
                fStack_110c = auVar76._20_4_ * auVar143._20_4_ * 0.00012207031 +
                              auVar17._20_4_ * 0.00012207031 * auVar118._20_4_ +
                              auVar18._20_4_ * auVar19._20_4_ * 0.00012207031;
                fStack_1108 = auVar76._24_4_ * auVar143._24_4_ * 0.00012207031 +
                              auVar17._24_4_ * 0.00012207031 * auVar118._24_4_ +
                              auVar18._24_4_ * auVar19._24_4_ * 0.00012207031;
                fStack_1104 = auVar143._28_4_ + 0.0 + auVar76._28_4_;
                local_1100[1] =
                     auVar76._4_4_ * auVar15._4_4_ * 0.00012207031 +
                     auVar118._4_4_ * auVar21._4_4_ * 0.00012207031 +
                     auVar16._4_4_ * 0.00012207031 * auVar18._4_4_;
                local_1100[0] =
                     auVar76._0_4_ * auVar15._0_4_ * 0.00012207031 +
                     auVar118._0_4_ * auVar21._0_4_ * 0.00012207031 +
                     auVar16._0_4_ * 0.00012207031 * auVar18._0_4_;
                local_1100[2] =
                     auVar76._8_4_ * auVar15._8_4_ * 0.00012207031 +
                     auVar118._8_4_ * auVar21._8_4_ * 0.00012207031 +
                     auVar16._8_4_ * 0.00012207031 * auVar18._8_4_;
                local_1100[3] =
                     auVar76._12_4_ * auVar15._12_4_ * 0.00012207031 +
                     auVar118._12_4_ * auVar21._12_4_ * 0.00012207031 +
                     auVar16._12_4_ * 0.00012207031 * auVar18._12_4_;
                fStack_10f0 = auVar76._16_4_ * auVar15._16_4_ * 0.00012207031 +
                              auVar118._16_4_ * auVar21._16_4_ * 0.00012207031 +
                              auVar16._16_4_ * 0.00012207031 * auVar18._16_4_;
                fStack_10ec = auVar76._20_4_ * auVar15._20_4_ * 0.00012207031 +
                              auVar118._20_4_ * auVar21._20_4_ * 0.00012207031 +
                              auVar16._20_4_ * 0.00012207031 * auVar18._20_4_;
                fStack_10e8 = auVar76._24_4_ * auVar15._24_4_ * 0.00012207031 +
                              auVar118._24_4_ * auVar21._24_4_ * 0.00012207031 +
                              auVar16._24_4_ * 0.00012207031 * auVar18._24_4_;
                fStack_10e4 = auVar15._28_4_ + auVar21._28_4_ + auVar18._28_4_;
                auVar79 = ZEXT3264(local_10e0);
                auVar83._8_4_ = 0x7f800000;
                auVar83._0_8_ = 0x7f8000007f800000;
                auVar83._12_4_ = 0x7f800000;
                auVar83._16_4_ = 0x7f800000;
                auVar83._20_4_ = 0x7f800000;
                auVar83._24_4_ = 0x7f800000;
                auVar83._28_4_ = 0x7f800000;
                auVar76 = vblendvps_avx(auVar83,local_10e0,auVar95);
                auVar118 = vshufps_avx(auVar76,auVar76,0xb1);
                auVar118 = vminps_avx(auVar76,auVar118);
                auVar143 = vshufpd_avx(auVar118,auVar118,5);
                auVar118 = vminps_avx(auVar118,auVar143);
                auVar143 = vperm2f128_avx(auVar118,auVar118,1);
                auVar118 = vminps_avx(auVar118,auVar143);
                auVar76 = vcmpps_avx(auVar76,auVar118,0);
                auVar118 = auVar95 & auVar76;
                if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar118 >> 0x7f,0) != '\0') ||
                      (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar118 >> 0xbf,0) != '\0') ||
                    (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar118[0x1f] < '\0') {
                  auVar95 = vandps_avx(auVar76,auVar95);
                }
                uVar61 = vmovmskps_avx(auVar95);
                uVar64 = 0;
                if (uVar61 != 0) {
                  for (; (uVar61 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                  }
                }
                uVar72 = (ulong)uVar64;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar63->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar129 = local_1120[uVar72];
                  fVar6 = local_1100[uVar72];
                  fVar7 = *(float *)(local_10c0 + uVar72 * 4);
                  fVar8 = *(float *)(local_10a0 + uVar72 * 4);
                  fVar9 = *(float *)(local_1080[0] + uVar72 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_10e0 + uVar72 * 4);
                  (ray->Ng).field_0.field_0.x = fVar7;
                  (ray->Ng).field_0.field_0.y = fVar8;
                  (ray->Ng).field_0.field_0.z = fVar9;
                  ray->u = fVar129;
                  ray->v = fVar6;
                  ray->primID = uVar71;
                  ray->geomID = uVar3;
                  pRVar5 = context->user;
                  ray->instID[0] = pRVar5->instID[0];
                  ray->instPrimID[0] = pRVar5->instPrimID[0];
                }
                else {
                  local_12e0._0_8_ = context->args;
                  local_12c0._0_8_ = context->user;
                  local_1300._0_8_ = uVar73;
                  local_1320._0_4_ = uVar71;
                  local_1340 = local_10e0;
                  local_1020 = auVar20;
                  do {
                    local_13c4 = local_1120[uVar72];
                    local_13c0 = local_1100[uVar72];
                    local_12a0._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_10e0 + uVar72 * 4);
                    local_1380._0_8_ = uVar72;
                    local_13d0 = *(float *)(local_10c0 + uVar72 * 4);
                    local_13cc = *(undefined4 *)(local_10a0 + uVar72 * 4);
                    local_13c8 = *(undefined4 *)(local_1080[0] + uVar72 * 4);
                    local_13bc = uVar71;
                    local_13b8 = (int)uVar73;
                    local_13b4 = *(uint *)local_12c0._0_8_;
                    local_13b0 = *(uint *)(local_12c0._0_8_ + 4);
                    local_144c = -1;
                    local_1400.valid = &local_144c;
                    local_1400.geometryUserPtr = pGVar63->userPtr;
                    local_1400.context = (RTCRayQueryContext *)local_12c0._0_8_;
                    local_1400.ray = (RTCRayN *)ray;
                    local_1400.hit = (RTCHitN *)&local_13d0;
                    local_1400.N = 1;
                    if (pGVar63->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012bf79b:
                      if (*(code **)(local_12e0._0_8_ + 0x10) != (code *)0x0) {
                        if (((*(byte *)local_12e0._0_8_ & 2) != 0) ||
                           ((*(byte *)((long)local_1440 + 0x3e) & 0x40) != 0)) {
                          (**(code **)(local_12e0._0_8_ + 0x10))(&local_1400);
                          auVar79 = ZEXT3264(local_1340);
                          uVar73 = local_1300._0_8_;
                          context = local_1448;
                          uVar71 = local_1320._0_4_;
                        }
                        if (*local_1400.valid == 0) goto LAB_012bf866;
                      }
                      (((Vec3f *)((long)local_1400.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1400.hit;
                      (((Vec3f *)((long)local_1400.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1400.hit + 4);
                      (((Vec3f *)((long)local_1400.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1400.hit + 8);
                      *(float *)((long)local_1400.ray + 0x3c) = *(float *)(local_1400.hit + 0xc);
                      *(float *)((long)local_1400.ray + 0x40) = *(float *)(local_1400.hit + 0x10);
                      *(float *)((long)local_1400.ray + 0x44) = *(float *)(local_1400.hit + 0x14);
                      *(float *)((long)local_1400.ray + 0x48) = *(float *)(local_1400.hit + 0x18);
                      *(float *)((long)local_1400.ray + 0x4c) = *(float *)(local_1400.hit + 0x1c);
                      *(float *)((long)local_1400.ray + 0x50) = *(float *)(local_1400.hit + 0x20);
                    }
                    else {
                      (*pGVar63->intersectionFilterN)(&local_1400);
                      auVar79 = ZEXT3264(local_1340);
                      uVar73 = local_1300._0_8_;
                      context = local_1448;
                      uVar71 = local_1320._0_4_;
                      if (*local_1400.valid != 0) goto LAB_012bf79b;
LAB_012bf866:
                      (ray->super_RayK<1>).tfar = (float)local_12a0._0_4_;
                    }
                    fVar129 = (ray->super_RayK<1>).tfar;
                    auVar78._4_4_ = fVar129;
                    auVar78._0_4_ = fVar129;
                    auVar78._8_4_ = fVar129;
                    auVar78._12_4_ = fVar129;
                    auVar78._16_4_ = fVar129;
                    auVar78._20_4_ = fVar129;
                    auVar78._24_4_ = fVar129;
                    auVar78._28_4_ = fVar129;
                    *(undefined4 *)(local_1280 + local_1380._0_8_ * 4) = 0;
                    auVar118 = local_1280;
                    auVar76 = vcmpps_avx(auVar79._0_32_,auVar78,2);
                    auVar95 = vandps_avx(auVar76,local_1280);
                    local_1280 = auVar95;
                    auVar118 = auVar118 & auVar76;
                    bVar57 = (auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar58 = (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar56 = (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar55 = SUB321(auVar118 >> 0x7f,0) != '\0';
                    bVar54 = (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar53 = SUB321(auVar118 >> 0xbf,0) != '\0';
                    bVar52 = (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar51 = auVar118[0x1f] < '\0';
                    uVar72 = local_1380._0_8_;
                    if (((((((bVar57 || bVar58) || bVar56) || bVar55) || bVar54) || bVar53) ||
                        bVar52) || bVar51) {
                      auVar84._8_4_ = 0x7f800000;
                      auVar84._0_8_ = 0x7f8000007f800000;
                      auVar84._12_4_ = 0x7f800000;
                      auVar84._16_4_ = 0x7f800000;
                      auVar84._20_4_ = 0x7f800000;
                      auVar84._24_4_ = 0x7f800000;
                      auVar84._28_4_ = 0x7f800000;
                      auVar76 = vblendvps_avx(auVar84,auVar79._0_32_,auVar95);
                      auVar118 = vshufps_avx(auVar76,auVar76,0xb1);
                      auVar118 = vminps_avx(auVar76,auVar118);
                      auVar143 = vshufpd_avx(auVar118,auVar118,5);
                      auVar118 = vminps_avx(auVar118,auVar143);
                      auVar143 = vperm2f128_avx(auVar118,auVar118,1);
                      auVar118 = vminps_avx(auVar118,auVar143);
                      auVar76 = vcmpps_avx(auVar76,auVar118,0);
                      auVar118 = auVar95 & auVar76;
                      if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar118 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar118 >> 0x7f,0) != '\0') ||
                            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar118 >> 0xbf,0) != '\0') ||
                          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar118[0x1f] < '\0') {
                        auVar95 = vandps_avx(auVar76,auVar95);
                      }
                      uVar64 = vmovmskps_avx(auVar95);
                      uVar3 = 0;
                      if (uVar64 != 0) {
                        for (; (uVar64 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                        }
                      }
                      uVar72 = (ulong)uVar3;
                    }
                    pGVar63 = local_1440;
                  } while (((((((bVar57 || bVar58) || bVar56) || bVar55) || bVar54) || bVar53) ||
                           bVar52) || bVar51);
                }
              }
            }
          }
          lVar62 = 0;
          auVar133 = ZEXT1664(local_11d0);
          auVar146 = ZEXT1664(local_11e0);
          auVar163 = ZEXT1664(local_11f0);
          auVar173 = ZEXT1664(local_1200);
          auVar182 = ZEXT1664(local_1210);
          auVar192 = ZEXT1664(local_1220);
          auVar201 = ZEXT1664(local_1230);
          auVar217 = ZEXT1664(local_1240);
          auVar227 = ZEXT1664(local_1250);
          auVar128 = ZEXT1664(local_1350);
        }
        else {
          local_1458 = uVar73 & 0xfffffffffffffff0;
          lVar62 = *(long *)(local_1458 + 0x30 + (ulong)*(uint *)(local_1458 + 0x2c));
        }
        fVar129 = (ray->super_RayK<1>).tfar;
        auVar79 = ZEXT1664(CONCAT412(fVar129,CONCAT48(fVar129,CONCAT44(fVar129,fVar129))));
        if (lVar62 != 0) {
          *(long *)*pauVar66 = lVar62;
          *(undefined4 *)(*pauVar66 + 8) = 0;
          pauVar66 = pauVar66 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }